

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool __thiscall Matrix::ApplyRowPermutation(Matrix *this,Permutation *permutation)

{
  bool bVar1;
  int iVar2;
  int source_row;
  bool bVar3;
  Matrix result;
  Matrix local_68;
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  local_48;
  
  iVar2 = Permutation::Size(permutation);
  if (iVar2 != this->n_) {
    __assert_fail("permutation.Size() == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/matrix.cpp"
                  ,0x119,"bool Matrix::ApplyRowPermutation(const Permutation &)");
  }
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::vector(&local_48,&this->elements_);
  local_68.n_ = (int)((ulong)((long)local_48.
                                    super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_48.
                                   super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  if (local_68.n_ == 0) {
    local_68.m_ = 0;
  }
  else {
    local_68.m_ = (int)((ulong)((long)((local_48.
                                        super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<Fraction,_std::allocator<Fraction>_>).
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)((local_48.
                                       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<Fraction,_std::allocator<Fraction>_>).
                                     _M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  local_68.elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_48);
  iVar2 = 0;
  if (this->n_ < 1) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    do {
      source_row = Permutation::At(permutation,iVar2);
      bVar1 = CopyRow(&local_68,this,source_row,iVar2);
      bVar3 = (bool)(bVar3 | bVar1);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->n_);
  }
  this->n_ = local_68.n_;
  this->m_ = local_68.m_;
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::operator=(&this->elements_,&local_68.elements_);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::~vector(&local_68.elements_);
  return bVar3;
}

Assistant:

bool Matrix::ApplyRowPermutation(const Permutation& permutation) {
  assert(permutation.Size() == n_);
  Matrix result(elements_);
  bool answer = false;
  for (int i = 0; i < n_; ++i) {
    answer |= result.CopyRow(*this, permutation.At(i), i);
  }
  operator=(result);

  return answer;
}